

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retDelay.c
# Opt level: O2

int Abc_NtkRetimeMinDelay
              (Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkCopy,int nDelayLim,int nIterLimit,int fForward,
              int fVerbose)

{
  uint __line;
  int iVar1;
  int iVar2;
  char *__assertion;
  int IterBest2;
  int IterBest;
  
  iVar1 = Abc_NtkRetimeMinDelayTry(pNtkCopy,nDelayLim,fForward,0,nIterLimit,&IterBest,fVerbose);
  if (IterBest == 0) {
    return 1;
  }
  iVar2 = Abc_NtkRetimeMinDelayTry(pNtk,nDelayLim,fForward,1,IterBest,&IterBest2,fVerbose);
  if (iVar1 == iVar2) {
    if (IterBest == IterBest2) {
      return 1;
    }
    __assertion = "IterBest == IterBest2";
    __line = 0x3d;
  }
  else {
    __assertion = "DelayBest == DelayBest2";
    __line = 0x3c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/ret/retDelay.c"
                ,__line,"int Abc_NtkRetimeMinDelay(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
}

Assistant:

int Abc_NtkRetimeMinDelay( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkCopy, int nDelayLim, int nIterLimit, int fForward, int fVerbose )
{
    int IterBest, DelayBest;
    int IterBest2, DelayBest2;
    // try to find the best delay iteration on a copy
    DelayBest = Abc_NtkRetimeMinDelayTry( pNtkCopy, nDelayLim, fForward, 0, nIterLimit, &IterBest, fVerbose );
    if ( IterBest == 0 )
        return 1;
    // perform the given number of iterations on the original network
    DelayBest2 = Abc_NtkRetimeMinDelayTry( pNtk, nDelayLim, fForward, 1, IterBest, &IterBest2, fVerbose );
    assert( DelayBest == DelayBest2 );
    assert( IterBest == IterBest2 );
    return 1;
}